

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O3

void probe_stack(char *sp0,size_t sz,size_t pgsz)

{
  ulong uVar1;
  char *sp;
  char *pcVar2;
  
  if (sz != 0) {
    uVar1 = 0;
    pcVar2 = sp0;
    do {
      *(undefined8 *)pcVar2 = *(undefined8 *)pcVar2;
      uVar1 = uVar1 + pgsz;
      pcVar2 = pcVar2 + -pgsz;
    } while (uVar1 < sz);
    _probe_stack_weak_dummy(sp0,sz);
    return;
  }
  return;
}

Assistant:

HU_NOINLINE
static void
probe_stack(volatile char *sp0, size_t sz, size_t pgsz)
{
    volatile char *sp = sp0;
#if HU_COMP_GNUC_P
    __asm__ __volatile__("" : : "r"(sp) : "memory");
#endif
    size_t i = 0;
    while (i < sz) {
        *(volatile uintptr_t *) sp |= (uintptr_t) 0;
        i += pgsz;
        sp -= pgsz;
    }

#ifdef HAVE_probe_stack_weak_dummy
    _probe_stack_weak_dummy(sp0, sz);
#endif
}